

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

void __thiscall Highs::reportModel(Highs *this,HighsModel *model)

{
  const_reference pvVar1;
  int *start;
  int *piVar2;
  long in_RSI;
  HighsLogOptions *in_RDI;
  HighsInt dim;
  HighsLp *in_stack_ffffffffffffffb8;
  HighsLogOptions *in_stack_ffffffffffffffc0;
  _Invoker_type *value;
  int iVar3;
  value_type vVar4;
  
  reportLp(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
  if (*(int *)(in_RSI + 0x398) != 0) {
    iVar3 = *(int *)(in_RSI + 0x398);
    value = &in_RDI[0x25].user_callback._M_invoker;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x3a0),(long)iVar3);
    vVar4 = *pvVar1;
    start = std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x487e89);
    piVar2 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x487ea3);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x487ebd);
    reportHessian(in_RDI,(HighsInt)((ulong)piVar2 >> 0x20),(HighsInt)piVar2,start,
                  (HighsInt *)CONCAT44(vVar4,iVar3),(double *)value);
  }
  return;
}

Assistant:

void Highs::reportModel(const HighsModel& model) {
  reportLp(options_.log_options, model.lp_, HighsLogType::kVerbose);
  if (model.hessian_.dim_) {
    const HighsInt dim = model.hessian_.dim_;
    reportHessian(options_.log_options, dim, model.hessian_.start_[dim],
                  model.hessian_.start_.data(), model.hessian_.index_.data(),
                  model.hessian_.value_.data());
  }
}